

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O2

int __thiscall
adios2::helper::CommImplMPI::Win_shared_query
          (CommImplMPI *this,Win *win,int rank,size_t *size,int *disp_unit,void *baseptr,
          string *hint)

{
  int value;
  undefined8 uVar1;
  long lVar2;
  size_t local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar1 = adios2::helper::CommWinImpl::Get(win);
  lVar2 = __dynamic_cast(uVar1,&CommWinImpl::typeinfo,&CommWinImplMPI::typeinfo,0);
  value = MPI_Win_shared_query(*(undefined8 *)(lVar2 + 8),rank,&local_70,disp_unit,baseptr);
  std::operator+(&local_48,"in call to Win_shared_query ",hint);
  std::operator+(&local_68,&local_48,"\n");
  anon_unknown_1::CheckMPIReturn(value,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  *size = local_70;
  return value;
}

Assistant:

int CommImplMPI::Win_shared_query(Comm::Win &win, int rank, size_t *size, int *disp_unit,
                                  void *baseptr, const std::string &hint) const
{
    CommWinImplMPI *w = dynamic_cast<CommWinImplMPI *>(CommWinImpl::Get(win));
    MPI_Aint asize;
    int ret = MPI_Win_shared_query(w->m_Win, rank, &asize, disp_unit, baseptr);
    CheckMPIReturn(ret, "in call to Win_shared_query " + hint + "\n");
    *size = static_cast<size_t>(asize);
    return ret;
}